

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O1

void __thiscall
OpenSteer::Camera::smoothCameraMove
          (Camera *this,Vec3 *newPosition,Vec3 *newTarget,Vec3 *newUp,float elapsedTime)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  _func_int *UNRECOVERED_JUMPTABLE;
  float fVar12;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float in_XMM1_Da;
  undefined1 auVar13 [16];
  float fVar14;
  
  if (this->smoothNextMove == true) {
    fVar12 = elapsedTime * this->smoothMoveSpeed;
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
    fVar14 = in_XMM1_Da;
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[4])(this);
    fVar8 = 1.0;
    if (fVar12 <= 1.0) {
      fVar8 = fVar12;
    }
    fVar8 = (float)(~-(uint)(fVar12 < 0.0) & (uint)fVar8);
    fVar12 = newPosition->z;
    uVar3 = newPosition->x;
    fVar1 = newTarget->z;
    fVar2 = (this->target).z;
    uVar4 = newTarget->x;
    uVar9 = newTarget->y;
    uVar5 = (this->target).x;
    uVar10 = (this->target).y;
    (this->target).x = ((float)uVar4 - (float)uVar5) * fVar8 + (float)uVar5;
    (this->target).y = ((float)uVar9 - (float)uVar10) * fVar8 + (float)uVar10;
    (this->target).z = (fVar1 - fVar2) * fVar8 + fVar2;
    uVar6 = newUp->x;
    fVar14 = fVar14 + (newUp->z - fVar14) * fVar8;
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[9])
              (((float)uVar3 - extraout_XMM0_Da) * fVar8 + extraout_XMM0_Da,
               (ulong)(uint)((fVar12 - in_XMM1_Da) * fVar8 + in_XMM1_Da),this);
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[5])
              (extraout_XMM0_Da_00 + ((float)uVar6 - extraout_XMM0_Da_00) * fVar8,this);
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[4])(this);
    if ((extraout_XMM0_Da_01 == Vec3::zero.x) && (!NAN(extraout_XMM0_Da_01) && !NAN(Vec3::zero.x)))
    {
      if ((extraout_XMM0_Db == Vec3::zero.y) && (!NAN(extraout_XMM0_Db) && !NAN(Vec3::zero.y))) {
        if ((fVar14 == Vec3::zero.z) && (!NAN(fVar14) && !NAN(Vec3::zero.z))) {
          fVar8 = Vec3::up.x;
          goto LAB_00130222;
        }
      }
    }
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[4])(this);
    auVar13._4_4_ = extraout_XMM0_Db_00;
    auVar13._0_4_ = extraout_XMM0_Da_02;
    auVar13._8_4_ = extraout_XMM0_Dc;
    auVar13._12_4_ = extraout_XMM0_Dd;
    fVar8 = fVar14 * fVar14 +
            extraout_XMM0_Da_02 * extraout_XMM0_Da_02 + extraout_XMM0_Db_00 * extraout_XMM0_Db_00;
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      fVar8 = SQRT(fVar8);
    }
    if (0.0 < fVar8) {
      auVar11._4_4_ = fVar8;
      auVar11._0_4_ = fVar8;
      auVar11._8_4_ = fVar8;
      auVar11._12_4_ = fVar8;
      auVar13 = divps(auVar13,auVar11);
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[5];
    fVar8 = auVar13._0_4_;
  }
  else {
    this->smoothNextMove = true;
    uVar7 = newPosition->x;
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[9])(uVar7,this);
    fVar8 = newTarget->y;
    (this->target).x = newTarget->x;
    (this->target).y = fVar8;
    (this->target).z = newTarget->z;
    fVar8 = newUp->x;
LAB_00130222:
    UNRECOVERED_JUMPTABLE =
         (this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[5];
  }
  (*UNRECOVERED_JUMPTABLE)(fVar8,this);
  return;
}

Assistant:

void 
OpenSteer::Camera::smoothCameraMove (const Vec3& newPosition,
                                     const Vec3& newTarget,
                                     const Vec3& newUp,
                                     const float elapsedTime)
{
    if (smoothNextMove)
    {
        const float smoothRate = elapsedTime * smoothMoveSpeed;

        Vec3 tempPosition = position();
        Vec3 tempUp = up();
        blendIntoAccumulator (smoothRate, newPosition, tempPosition);
        blendIntoAccumulator (smoothRate, newTarget,   target);
        blendIntoAccumulator (smoothRate, newUp,       tempUp);
        setPosition (tempPosition);
        setUp (tempUp);

        // xxx not sure if these are needed, seems like a good idea
        // xxx (also if either up or oldUP are zero, use the other?)
        // xxx (even better: force up to be perp to target-position axis))
        if (up() == Vec3::zero)
            setUp (Vec3::up);
        else
            setUp (up().normalize ());
    }
    else
    {
        smoothNextMove = true;

        setPosition (newPosition);
        target   = newTarget;
        setUp (newUp);
    }
}